

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O3

Type * parse_type_name(Translation_Data *translation_data,Scope *scope)

{
  Denotation_Prototype *prototype;
  Type *extraout_RAX;
  Denoted_Base *base;
  
  prototype = parse_declaration_specifiers_inner(translation_data,scope,'\0');
  get_denoted_base(prototype);
  parse_declarator_inner(translation_data,scope,base);
  delete_denoted_prototype(prototype);
  return extraout_RAX;
}

Assistant:

struct Type* parse_type_name(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct Denotation_Prototype *prototype;
	struct Type *ret;
	prototype=parse_specifier_qualifier_list(translation_data,scope);
	ret=parse_abstract_declarator(translation_data,scope,prototype);
	delete_denoted_prototype(prototype);
	return ret;
}